

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case0391(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  Decl local_730;
  Decl local_668;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  Decl local_550;
  Decl local_488;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"void x ( y z [ ] , w z ) ;",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"x",&local_369);
  pDVar1 = Decl::Function(&local_348,&local_368,File);
  pDVar1 = Ty::Void(&pDVar1->ty_,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"y",&local_391);
  pDVar1 = Ty::Typedef(pTVar2,&local_390,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,FromArrayToPointer);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"w",&local_3b9);
  pDVar1 = Ty::Typedef(pTVar2,&local_3b8,None);
  Decl::Decl(&local_280,pDVar1);
  pEVar3 = Expectation::declaration(&local_1b8,&local_280);
  Decl::Decl(&local_550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"z",&local_571);
  pDVar1 = Decl::Object(&local_550,&local_570,ParameterDeclaration,FunctionPrototype);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"w",&local_599);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_598,None);
  Decl::Decl(&local_488,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_488);
  Decl::Decl(&local_730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"z",&local_751);
  pDVar1 = Decl::Object(&local_730,&local_750,ParameterDeclaration,FunctionPrototype);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"y",&local_779);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_778,None);
  __len = 1;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,FromArrayToPointer);
  Decl::Decl(&local_668,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_668);
  Expectation::Expectation(&local_100,pEVar3);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_668);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  Decl::~Decl(&local_730);
  Decl::~Decl(&local_488);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  Decl::~Decl(&local_550);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case0391()
{
    bind("void x ( y z [ ] , w z ) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("y")
                  .ty_.atParam().Derived(TypeKind::Pointer, CVR::None, Decay::FromArrayToPointer)
                  .ty_.addParam().Typedef("w"))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Typedef("w"))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Typedef("y")
                  .ty_.Derived(TypeKind::Pointer, CVR::None, Decay::FromArrayToPointer)));
}